

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O0

state_status_t
tchecker::ta::final(system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,vedge_sptr_t *vedge,
                   sync_id_t *sync_id,clock_constraint_container_t *invariant,
                   final_value_t *final_value)

{
  bool bVar1;
  int iVar2;
  integer_t iVar3;
  __tuple_element_t<0UL,_tuple<range_t<values_iterator_t,_values_iterator_t>,_range_t<values_iterator_t,_values_iterator_t>_>_>
  *v_00;
  __tuple_element_t<1UL,_tuple<range_t<values_iterator_t,_values_iterator_t>,_range_t<values_iterator_t,_values_iterator_t>_>_>
  *this;
  system_t *system_00;
  array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  size_t sVar4;
  values_iterator_t *pvVar5;
  runtime_error *this_02;
  make_array_t<int,_4UL,_tchecker::intval_base_t> *this_03;
  int *piVar6;
  vm_t *this_04;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *this_05;
  iterator_t puVar7;
  bytecode_t *bytecode;
  intval_t *intval_00;
  loc_id_t loc_id;
  iterator_t __end2_1;
  iterator_t __begin2_1;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *__range2_1;
  vm_t *vm;
  iterator iStack_88;
  integer_t v;
  values_iterator_t __end2;
  values_iterator_t __begin2;
  type *__range2;
  intvar_id_t id;
  intvar_id_t intvars_size;
  flat_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *intvars;
  state_status_t status;
  type *valuation;
  type *edges;
  clock_constraint_container_t *invariant_local;
  sync_id_t *sync_id_local;
  vedge_sptr_t *vedge_local;
  intval_sptr_t *intval_local;
  vloc_sptr_t *vloc_local;
  system_t *system_local;
  
  v_00 = std::
         get<0ul,tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,tchecker::system::locs_t::const_iterator_t>>::values_iterator_t,tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,tchecker::system::locs_t::const_iterator_t>>::values_iterator_t>,tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,tchecker::integer_iterator_t<int>>>::values_iterator_t,tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,tchecker::integer_iterator_t<int>>>::values_iterator_t>>
                   (final_value);
  this = std::
         get<1ul,tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,tchecker::system::locs_t::const_iterator_t>>::values_iterator_t,tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,tchecker::system::locs_t::const_iterator_t>>::values_iterator_t>,tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,tchecker::integer_iterator_t<int>>>::values_iterator_t,tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,tchecker::integer_iterator_t<int>>>::values_iterator_t>>
                   (final_value);
  system_00 = system_t::as_syncprod_system(system);
  system_local._4_4_ = syncprod::final(system_00,vloc,vedge,sync_id,v_00);
  if (system_local._4_4_ == 1) {
    this_00 = &tchecker::system::intvars_t::integer_variables
                         (&(system->super_system_t).super_system_t.super_intvars_t)->
               super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    this_01 = (variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::flattened(this_00);
    sVar4 = variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this_01);
    __range2._0_4_ = 0;
    pvVar5 = range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>
             ::begin(this);
    __end2._it._M_current = (iterator)(pvVar5->_it)._M_current;
    pvVar5 = range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>
             ::end(this);
    iStack_88._M_current = (pvVar5->_it)._M_current;
    while (bVar1 = cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
                   ::values_iterator_t::operator!=
                             (&__end2,(values_iterator_t *)&stack0xffffffffffffff78), bVar1) {
      iVar2 = cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
              ::values_iterator_t::operator*(&__end2);
      if ((uint)sVar4 <= (uint)__range2) {
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_02,"tchecker::ta::final: valuation of incompatible size");
        __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this_03 = (make_array_t<int,_4UL,_tchecker::intval_base_t> *)
                intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                ::operator*(intval);
      piVar6 = make_array_t<int,_4UL,_tchecker::intval_base_t>::operator[]
                         (this_03,(capacity_t_conflict)(uint)__range2);
      *piVar6 = iVar2;
      __range2._0_4_ = (uint)__range2 + 1;
      cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
      ::values_iterator_t::operator++(&__end2);
    }
    this_04 = system_t::vm(system);
    this_05 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
              intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
              ::operator*(vloc);
    __end2_1 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::begin(this_05);
    puVar7 = make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t>::end(this_05);
    for (; __end2_1 != puVar7; __end2_1 = __end2_1 + 1) {
      bytecode = system_t::invariant_bytecode(system,*__end2_1);
      intval_00 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                   ::operator*(intval)->super_intval_t;
      iVar3 = vm_t::run(this_04,bytecode,intval_00,invariant,
                        (clock_reset_container_t *)place_holder_clkreset);
      if (iVar3 == 0) {
        return 0x10;
      }
      bVar1 = std::vector<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_>::empty
                        ((vector<tchecker::clock_reset_t,_std::allocator<tchecker::clock_reset_t>_>
                          *)place_holder_clkreset);
      if (!bVar1) {
        __assert_fail("place_holder_clkreset.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/ta.cc"
                      ,0x56,
                      "tchecker::state_status_t tchecker::ta::final(const tchecker::ta::system_t &, const tchecker::vloc_sptr_t &, const tchecker::intval_sptr_t &, const tchecker::vedge_sptr_t &, tchecker::sync_id_t &, tchecker::clock_constraint_container_t &, const tchecker::ta::final_value_t &)"
                     );
      }
    }
    system_local._4_4_ = 1;
  }
  return system_local._4_4_;
}

Assistant:

tchecker::state_status_t final(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                               tchecker::intval_sptr_t const & intval, tchecker::vedge_sptr_t const & vedge,
                               tchecker::sync_id_t & sync_id, tchecker::clock_constraint_container_t & invariant,
                               tchecker::ta::final_value_t const & final_value)
{
  auto && [edges, valuation] = final_value;

  // compute vloc and vedge from final edges
  auto status = tchecker::syncprod::final(system.as_syncprod_system(), vloc, vedge, sync_id, edges);
  if (status != STATE_OK)
    return status;

  // compute intval
  auto const & intvars = system.integer_variables().flattened();
  tchecker::intvar_id_t intvars_size = intvars.size();
  tchecker::intvar_id_t id = 0;
  for (tchecker::integer_t v : valuation) {
    if (id >= intvars_size)
      throw std::runtime_error("tchecker::ta::final: valuation of incompatible size");
    (*intval)[id] = v;
    ++id;
  }

  // check invariant
  tchecker::vm_t & vm = system.vm();
  for (tchecker::loc_id_t loc_id : *vloc) {
    if (vm.run(system.invariant_bytecode(loc_id), *intval, invariant, place_holder_clkreset) == 0)
      return tchecker::STATE_INTVARS_TGT_INVARIANT_VIOLATED;
    assert(place_holder_clkreset.empty());
  }

  return tchecker::STATE_OK;
}